

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O1

coda_product_class * coda_data_dictionary_get_product_class(char *name)

{
  long *plVar1;
  long lVar2;
  coda_product_class *pcVar3;
  
  plVar1 = (long *)__tls_get_addr(&PTR_001e0f50);
  if (*plVar1 == 0) {
    pcVar3 = (coda_product_class *)0x0;
    coda_set_error(-400,"coda has not been initialized");
  }
  else {
    lVar2 = coda_hashtable_get_index_from_name(*(hashtable **)(*plVar1 + 0x10),name);
    if ((int)lVar2 == -1) {
      pcVar3 = (coda_product_class *)0x0;
      coda_set_error(-400,"data dictionary does not contain a product class with name %s",name);
    }
    else {
      pcVar3 = *(coda_product_class **)(*(long *)(*plVar1 + 8) + (long)(int)lVar2 * 8);
    }
  }
  return pcVar3;
}

Assistant:

coda_product_class *coda_data_dictionary_get_product_class(const char *name)
{
    int index;

    if (coda_global_data_dictionary == NULL)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "coda has not been initialized");
        return NULL;
    }

    index = hashtable_get_index_from_name(coda_global_data_dictionary->hash_data, name);
    if (index == -1)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "data dictionary does not contain a product class with name %s",
                       name);
        return NULL;
    }

    return coda_global_data_dictionary->product_class[index];
}